

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPRequest.hpp
# Opt level: O0

ssize_t __thiscall http::Request::send(Request *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uchar (*pauVar1) [2];
  sockaddr *psVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar3;
  int iVar4;
  RequestError *this_01;
  char *__name;
  char *__service;
  system_error *this_02;
  error_category *__ecat;
  size_type sVar5;
  const_iterator __first;
  const_iterator __last;
  iterator iVar6;
  pointer paVar7;
  ssize_t sVar8;
  iterator iVar9;
  uchar *puVar10;
  uchar *puVar11;
  ulong uVar12;
  long lVar13;
  reference __str;
  ResponseError *this_03;
  unsigned_long *puVar14;
  socklen_t __len;
  undefined4 in_register_00000034;
  InternetProtocol *pIVar15;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar16;
  undefined4 in_register_00000084;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_15d0;
  const_iterator local_15c8;
  uchar *local_15c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_15b8;
  const_iterator local_15b0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_15a8;
  const_iterator local_15a0;
  allocator<char> local_1591;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1590;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1588;
  undefined1 local_1580 [8];
  string line_1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1548;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  i_1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1538;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1530;
  const_iterator local_1528;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1520;
  const_iterator local_1518;
  uchar *local_1510;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1508;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1500;
  const_iterator local_14f8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_14f0;
  const_iterator local_14e8;
  uchar *local_14e0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_14d8;
  uchar *local_14d0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_14c8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_14c0;
  const_iterator local_14b8;
  size_type local_14b0;
  unsigned_long local_14a8;
  unsigned_long toWrite;
  undefined1 local_1498 [6];
  bool dataReceived;
  undefined8 local_1478;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1470;
  undefined8 local_1468 [2];
  undefined1 local_1458 [8];
  undefined1 local_1450 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1448;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1440;
  undefined8 local_1438;
  undefined8 local_1430;
  undefined8 local_1420;
  undefined8 local_1418;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1410;
  undefined8 local_1408;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1400;
  undefined8 local_13f8;
  undefined1 local_13f0 [8];
  string headerValue;
  string headerName;
  size_type pos_1;
  char *local_13a0;
  pointer local_1398;
  size_type pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  size_type length;
  size_type lastPos;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1358;
  const_iterator local_1350;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1348;
  const_iterator local_1340;
  allocator<char> local_1331;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1330;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1328;
  undefined1 local_1320 [8];
  string line;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_12e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> i;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_12d8;
  const_iterator local_12d0;
  ssize_t local_12c8;
  size_t size_1;
  unsigned_long uStack_12b8;
  bool removeCrlfAfterChunk;
  size_t expectedChunkSize;
  unsigned_long uStack_12a8;
  bool chunkedResponse;
  unsigned_long contentLength;
  undefined1 local_1298 [5];
  bool contentLengthReceived;
  bool parsedHeaders;
  bool firstLine;
  vector<unsigned_char,_std::allocator<unsigned_char>_> responseData;
  uchar local_1278 [6];
  uint8_t crlf [2];
  uint8_t tempBuffer [4096];
  size_t size;
  uchar *sendData;
  size_type remaining;
  iterator iStack_250;
  Socket socket;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_238;
  const_iterator local_230;
  allocator<unsigned_char> local_221;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  undefined1 local_210 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> requestData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  reference local_138;
  string *header;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string headerData;
  undefined1 local_b0 [8];
  unique_ptr<addrinfo,_void_(*)(addrinfo_*)> addressInfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  pointer local_78;
  addrinfo *info;
  addrinfo hints;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *headers_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *body_local;
  string *method_local;
  Request *this_local;
  Response *response;
  
  pIVar15 = (InternetProtocol *)CONCAT44(in_register_00000034,__fd);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_register_00000084,__flags);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (pIVar15 + 8),"http");
  if (bVar3) {
    this_01 = (RequestError *)__cxa_allocate_exception(0x10);
    RequestError::RequestError(this_01,"Only HTTP scheme is supported");
    __cxa_throw(this_01,&RequestError::typeinfo,RequestError::~RequestError);
  }
  memset(&info,0,0x30);
  info._4_4_ = detail::getAddressFamily(*pIVar15);
  hints.ai_flags = 1;
  __name = (char *)std::__cxx11::string::c_str();
  __service = (char *)std::__cxx11::string::c_str();
  iVar4 = getaddrinfo(__name,__service,(addrinfo *)&info,(addrinfo **)&local_78);
  if (iVar4 != 0) {
    addressInfo._M_t.super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>._M_t.
    super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.
    super__Head_base<0UL,_addrinfo_*,_false>._M_head_impl._7_1_ = 1;
    this_02 = (system_error *)__cxa_allocate_exception(0x20);
    iVar4 = detail::getLastError();
    __ecat = (error_category *)std::_V2::system_category();
    std::operator+(&local_98,"Failed to get address info of ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (pIVar15 + 0x28));
    std::system_error::system_error(this_02,iVar4,__ecat,&local_98);
    addressInfo._M_t.super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>._M_t.
    super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.
    super__Head_base<0UL,_addrinfo_*,_false>._M_head_impl._7_1_ = 0;
    __cxa_throw(this_02,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  headerData.field_2._8_8_ = freeaddrinfo;
  std::unique_ptr<addrinfo,void(*)(addrinfo*)>::unique_ptr<void(*)(addrinfo*),void>
            ((unique_ptr<addrinfo,void(*)(addrinfo*)> *)local_b0,local_78,
             (__enable_if_t<_is_lvalue_reference<void_(*)(addrinfo_*)>::value,_void_(*&&)(addrinfo_*)>
              )((long)&headerData.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf," ");
  std::operator+(&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (pIVar15 + 0x68));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 &local_f8," HTTP/1.1\r\n");
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&__range2);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  header = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&header), bVar3) {
    local_138 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
    std::operator+(&local_158,local_138,"\r\n");
    std::__cxx11::string::operator+=((string *)local_d8,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  std::operator+(&local_1d8,"Host: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (pIVar15 + 0x28));
  std::operator+(&local_1b8,&local_1d8,"\r\nContent-Length: ");
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__n);
  std::__cxx11::to_string
            ((string *)
             &requestData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,sVar5);
  std::operator+(&local_198,&local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &requestData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator+(&local_178,&local_198,"\r\n\r\n");
  std::__cxx11::string::operator+=((string *)local_d8,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string
            ((string *)
             &requestData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  local_218._M_current = (char *)std::__cxx11::string::begin();
  local_220._M_current = (char *)std::__cxx11::string::end();
  std::allocator<unsigned_char>::allocator(&local_221);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_210,local_218,local_220,
             &local_221);
  std::allocator<unsigned_char>::~allocator(&local_221);
  local_238._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_210);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_230,&local_238);
  __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__n);
  __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__n);
  iVar6 = std::vector<unsigned_char,std::allocator<unsigned_char>>::
          insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_210,local_230,
                     __first._M_current,__last._M_current);
  iStack_250 = iVar6;
  detail::Socket::Socket((Socket *)((long)&remaining + 4),*pIVar15);
  __len = (socklen_t)iVar6._M_current;
  paVar7 = std::unique_ptr<addrinfo,_void_(*)(addrinfo_*)>::operator->
                     ((unique_ptr<addrinfo,_void_(*)(addrinfo_*)> *)local_b0);
  psVar2 = paVar7->ai_addr;
  paVar7 = std::unique_ptr<addrinfo,_void_(*)(addrinfo_*)>::operator->
                     ((unique_ptr<addrinfo,_void_(*)(addrinfo_*)> *)local_b0);
  detail::Socket::connect
            ((Socket *)((long)&remaining + 4),(int)psVar2,(sockaddr *)(ulong)paVar7->ai_addrlen,
             __len);
  sendData = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_210)
  ;
  size = (size_t)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_210);
  for (; sendData != (uchar *)0x0; sendData = sendData + -sVar8) {
    sVar8 = detail::Socket::send((Socket *)((long)&remaining + 4),(int)size,sendData,0x4000,__flags)
    ;
    size = sVar8 + size;
  }
  responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_2_ = 0xa0d;
  responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  Response::Response((Response *)this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
  contentLength._7_1_ = 1;
  contentLength._6_1_ = 0;
  contentLength._5_1_ = 0;
  uStack_12a8 = 0;
  expectedChunkSize._7_1_ = 0;
  uStack_12b8 = 0;
  size_1._7_1_ = 0;
LAB_0017d6d9:
  do {
    do {
      local_12c8 = detail::Socket::recv
                             ((Socket *)((long)&remaining + 4),(int)local_1278,(void *)0x1000,0x4000
                              ,__flags);
      if (local_12c8 == 0) goto LAB_0017e57d;
      local_12d8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_12d0,&local_12d8);
      i._M_current = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                              insert<unsigned_char*,void>
                                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                         local_1298,local_12d0,local_1278,local_1278 + local_12c8);
      if ((contentLength._6_1_ & 1) == 0) {
        do {
          iVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
          iVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
          pauVar1 = (uchar (*) [2])
                    ((long)&responseData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 6);
          puVar10 = std::begin<unsigned_char_const,2ul>(pauVar1);
          puVar11 = std::end<unsigned_char_const,2ul>(pauVar1);
          local_12e8 = std::
                       search<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*>
                                 (iVar6._M_current,iVar9._M_current,puVar10,puVar11);
          line.field_2._8_8_ =
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
          bVar3 = __gnu_cxx::operator==
                            (&local_12e8,
                             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)((long)&line.field_2 + 8));
          if (bVar3) break;
          local_1328._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_1298);
          local_1330._M_current = local_12e8._M_current;
          std::allocator<char>::allocator();
          std::__cxx11::string::
          string<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((string *)local_1320,local_1328,local_1330,&local_1331);
          std::allocator<char>::~allocator(&local_1331);
          local_1348._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_1298);
          __gnu_cxx::
          __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::__normal_iterator<unsigned_char*>
                    ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)&local_1340,&local_1348);
          local_1358 = __gnu_cxx::
                       __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ::operator+(&local_12e8,2);
          __gnu_cxx::
          __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::__normal_iterator<unsigned_char*>
                    ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)&local_1350,&local_1358);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298,local_1340,
                     local_1350);
          uVar12 = std::__cxx11::string::empty();
          if ((uVar12 & 1) == 0) {
            if ((contentLength._7_1_ & 1) == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&this->scheme,(value_type *)local_1320);
              lVar13 = std::__cxx11::string::find((char)local_1320,0x3a);
              if (lVar13 != -1) {
                std::__cxx11::string::substr
                          ((ulong)((long)&headerValue.field_2 + 8),(ulong)local_1320);
                std::__cxx11::string::substr((ulong)local_13f0,(ulong)local_1320);
                local_1400._M_current = (char *)std::__cxx11::string::begin();
                __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                __normal_iterator<char*>
                          ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_13f8,
                           &local_1400);
                local_1418 = std::__cxx11::string::begin();
                local_1420 = std::__cxx11::string::end();
                local_1410 = std::
                             find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,http::Request::send(std::__cxx11::string_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(int)_1_>
                                       (local_1418,local_1420);
                __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                __normal_iterator<char*>
                          ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_1408,
                           &local_1410);
                local_1430 = std::__cxx11::string::erase(local_13f0,local_13f8,local_1408);
                std::__cxx11::string::rbegin();
                std::__cxx11::string::rend();
                std::
                find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,http::Request::send(std::__cxx11::string_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(int)_2_>
                          (&local_1448,local_1450,local_1458);
                local_1440._M_current =
                     (char *)std::
                             reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::base(&local_1448);
                __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                __normal_iterator<char*>
                          ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_1438,
                           &local_1440);
                local_1470._M_current = (char *)std::__cxx11::string::end();
                __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                __normal_iterator<char*>
                          ((__normal_iterator<char_const*,std::__cxx11::string> *)local_1468,
                           &local_1470);
                local_1478 = std::__cxx11::string::erase(local_13f0,local_1438,local_1468[0]);
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&headerValue.field_2 + 8),"Content-Length");
                if (bVar3) {
                  uStack_12a8 = std::__cxx11::stoul((string *)local_13f0,(size_t *)0x0,10);
                  contentLength._5_1_ = 1;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             ((long)&(this->scheme).field_2 + 8),uStack_12a8);
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&headerValue.field_2 + 8),"Transfer-Encoding");
                  if (bVar3) {
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_13f0,"chunked");
                    if (!bVar3) {
                      toWrite._7_1_ = 1;
                      this_03 = (ResponseError *)__cxa_allocate_exception(0x10);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1498,"Unsupported transfer encoding: ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_13f0);
                      ResponseError::ResponseError(this_03,(string *)local_1498);
                      toWrite._7_1_ = 0;
                      __cxa_throw(this_03,&ResponseError::typeinfo,ResponseError::~ResponseError);
                    }
                    expectedChunkSize._7_1_ = 1;
                  }
                }
                std::__cxx11::string::~string((string *)local_13f0);
                std::__cxx11::string::~string((string *)(headerValue.field_2._M_local_buf + 8));
              }
            }
            else {
              contentLength._7_1_ = 0;
              length = 0;
              parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)std::__cxx11::string::length();
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&pos);
              while (length < &(parts.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1) {
                local_1398 = (pointer)std::__cxx11::string::find((char)local_1320,0x20);
                if (local_1398 == (pointer)0xffffffffffffffff) {
                  local_1398 = parts.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                }
                if (local_1398 != (pointer)length) {
                  lVar13 = std::__cxx11::string::data();
                  local_13a0 = (char *)(lVar13 + length);
                  pos_1 = (long)local_1398 - length;
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const*,unsigned_long>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &pos,&local_13a0,&pos_1);
                }
                length = (size_type)&local_1398->field_0x1;
              }
              sVar5 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&pos);
              if (1 < sVar5) {
                __str = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&pos,1);
                iVar4 = std::__cxx11::stoi(__str,(size_t *)0x0,10);
                *(int *)this = iVar4;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&pos);
            }
            bVar3 = false;
          }
          else {
            contentLength._6_1_ = 1;
            bVar3 = true;
          }
          std::__cxx11::string::~string((string *)local_1320);
        } while (!bVar3);
      }
    } while ((contentLength._6_1_ & 1) == 0);
    if ((expectedChunkSize._7_1_ & 1) == 0) {
      pvVar16 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                ((this->scheme).field_2._M_local_buf + 8);
      local_15d0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar16);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_15c8,&local_15d0);
      iVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
      iVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                (pvVar16,local_15c8,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )iVar6._M_current,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )iVar9._M_current);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
      if (((contentLength._5_1_ & 1) != 0) &&
         (sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             ((long)&(this->scheme).field_2 + 8)), uStack_12a8 <= sVar5))
      goto LAB_0017e57d;
      goto LAB_0017d6d9;
    }
    toWrite._6_1_ = 0;
    do {
      while (uStack_12b8 != 0) {
        local_14b0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298)
        ;
        puVar14 = std::min<unsigned_long>(&stack0xffffffffffffed48,&local_14b0);
        local_14a8 = *puVar14;
        pvVar16 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                  ((this->scheme).field_2._M_local_buf + 8);
        local_14c0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar16);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_14b8,&local_14c0);
        local_14c8._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298
                                );
        local_14d8._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298
                                );
        local_14d0 = (uchar *)__gnu_cxx::
                              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ::operator+(&local_14d8,local_14a8);
        local_14e0 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                              insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                        (pvVar16,local_14b8,local_14c8,
                                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          )local_14d0);
        local_14f0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298
                                );
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_14e8,&local_14f0);
        local_1508._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298
                                );
        local_1500 = __gnu_cxx::
                     __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator+(&local_1508,local_14a8);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_14f8,&local_1500);
        local_1510 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         local_1298,local_14e8,local_14f8);
        uStack_12b8 = uStack_12b8 - local_14a8;
        if (uStack_12b8 == 0) {
          size_1._7_1_ = 1;
        }
        bVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
        if (bVar3) goto LAB_0017e49b;
      }
      if ((size_1._7_1_ & 1) != 0) {
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
        if (sVar5 < 2) break;
        size_1._7_1_ = 0;
        local_1520._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298
                                );
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_1518,&local_1520);
        local_1538._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298
                                );
        local_1530 = __gnu_cxx::
                     __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator+(&local_1538,2);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_1528,&local_1530);
        i_1._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298
                                 ,local_1518,local_1528);
      }
      iVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
      iVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
      pauVar1 = (uchar (*) [2])
                ((long)&responseData.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 6);
      puVar10 = std::begin<unsigned_char_const,2ul>(pauVar1);
      puVar11 = std::end<unsigned_char_const,2ul>(pauVar1);
      local_1548 = std::
                   search<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*>
                             (iVar6._M_current,iVar9._M_current,puVar10,puVar11);
      line_1.field_2._8_8_ =
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
      bVar3 = __gnu_cxx::operator==
                        (&local_1548,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)((long)&line_1.field_2 + 8));
      if (bVar3) break;
      local_1588._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
      local_1590._M_current = local_1548._M_current;
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((string *)local_1580,local_1588,local_1590,&local_1591);
      std::allocator<char>::~allocator(&local_1591);
      local_15a8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_15a0,&local_15a8);
      local_15b8 = __gnu_cxx::
                   __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator+(&local_1548,2);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_15b0,&local_15b8);
      local_15c0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       local_1298,local_15a0,local_15b0);
      uStack_12b8 = std::__cxx11::stoul((string *)local_1580,(size_t *)0x0,0x10);
      if (uStack_12b8 == 0) {
        toWrite._6_1_ = 1;
        lastPos._4_4_ = 0xc;
      }
      else {
        lastPos._4_4_ = 0;
      }
      std::__cxx11::string::~string((string *)local_1580);
    } while (lastPos._4_4_ == 0);
LAB_0017e49b:
    if ((toWrite._6_1_ & 1) != 0) {
LAB_0017e57d:
      responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1298);
      if ((responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) {
        Response::~Response((Response *)this);
      }
      detail::Socket::~Socket((Socket *)((long)&remaining + 4));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_210);
      std::__cxx11::string::~string((string *)local_d8);
      std::unique_ptr<addrinfo,_void_(*)(addrinfo_*)>::~unique_ptr
                ((unique_ptr<addrinfo,_void_(*)(addrinfo_*)> *)local_b0);
      return (ssize_t)this;
    }
  } while( true );
}

Assistant:

Response send(const std::string& method,
                      const std::vector<uint8_t>& body,
                      const std::vector<std::string>& headers)
        {
            if (scheme != "http")
                throw RequestError("Only HTTP scheme is supported");

            addrinfo hints = {};
            hints.ai_family = getAddressFamily(internetProtocol);
            hints.ai_socktype = SOCK_STREAM;

            addrinfo* info;
            if (getaddrinfo(domain.c_str(), port.c_str(), &hints, &info) != 0)
                throw std::system_error(getLastError(), std::system_category(), "Failed to get address info of " + domain);

            std::unique_ptr<addrinfo, decltype(&freeaddrinfo)> addressInfo(info, freeaddrinfo);

            std::string headerData = method + " " + path + " HTTP/1.1\r\n";

            for (const std::string& header : headers)
                headerData += header + "\r\n";

            headerData += "Host: " + domain + "\r\n"
                "Content-Length: " + std::to_string(body.size()) + "\r\n"
                "\r\n";

            std::vector<uint8_t> requestData(headerData.begin(), headerData.end());
            requestData.insert(requestData.end(), body.begin(), body.end());

            Socket socket(internetProtocol);

            // take the first address from the list
            socket.connect(addressInfo->ai_addr, static_cast<socklen_t>(addressInfo->ai_addrlen));

            auto remaining = requestData.size();
            auto sendData = requestData.data();

            // send the request
            while (remaining > 0)
            {
                const auto size = socket.send(sendData, remaining, noSignal);
                remaining -= size;
                sendData += size;
            }

            std::uint8_t tempBuffer[4096];
            constexpr std::uint8_t crlf[] = {'\r', '\n'};
            Response response;
            std::vector<std::uint8_t> responseData;
            bool firstLine = true;
            bool parsedHeaders = false;
            bool contentLengthReceived = false;
            unsigned long contentLength = 0;
            bool chunkedResponse = false;
            std::size_t expectedChunkSize = 0;
            bool removeCrlfAfterChunk = false;

            // read the response
            for (;;)
            {
                const auto size = socket.recv(tempBuffer, sizeof(tempBuffer), noSignal);

                if (size == 0)
                    break; // disconnected

                responseData.insert(responseData.end(), tempBuffer, tempBuffer + size);

                if (!parsedHeaders)
                    for (;;)
                    {
                        const auto i = std::search(responseData.begin(), responseData.end(), std::begin(crlf), std::end(crlf));

                        // didn't find a newline
                        if (i == responseData.end()) break;

                        const std::string line(responseData.begin(), i);
                        responseData.erase(responseData.begin(), i + 2);

                        // empty line indicates the end of the header section
                        if (line.empty())
                        {
                            parsedHeaders = true;
                            break;
                        }
                        else if (firstLine) // first line
                        {
                            firstLine = false;

                            std::string::size_type lastPos = 0;
                            const auto length = line.length();
                            std::vector<std::string> parts;

                            // tokenize first line
                            while (lastPos < length + 1)
                            {
                                auto pos = line.find(' ', lastPos);
                                if (pos == std::string::npos) pos = length;

                                if (pos != lastPos)
                                    parts.emplace_back(line.data() + lastPos,
                                                       static_cast<std::vector<std::string>::size_type>(pos) - lastPos);

                                lastPos = pos + 1;
                            }

                            if (parts.size() >= 2)
                                response.status = std::stoi(parts[1]);
                        }
                        else // headers
                        {
                            response.headers.push_back(line);

                            const auto pos = line.find(':');

                            if (pos != std::string::npos)
                            {
                                std::string headerName = line.substr(0, pos);
                                std::string headerValue = line.substr(pos + 1);

                                // ltrim
                                headerValue.erase(headerValue.begin(),
                                                  std::find_if(headerValue.begin(), headerValue.end(),
                                                               [](int c) {return !std::isspace(c);}));

                                // rtrim
                                headerValue.erase(std::find_if(headerValue.rbegin(), headerValue.rend(),
                                                               [](int c) {return !std::isspace(c);}).base(),
                                                  headerValue.end());

                                if (headerName == "Content-Length")
                                {
                                    contentLength = std::stoul(headerValue);
                                    contentLengthReceived = true;
                                    response.body.reserve(contentLength);
                                }
                                else if (headerName == "Transfer-Encoding")
                                {
                                    if (headerValue == "chunked")
                                        chunkedResponse = true;
                                    else
                                        throw ResponseError("Unsupported transfer encoding: " + headerValue);
                                }
                            }
                        }
                    }

                if (parsedHeaders)
                {
                    // Content-Length must be ignored if Transfer-Encoding is received
                    if (chunkedResponse)
                    {
                        bool dataReceived = false;
                        for (;;)
                        {
                            if (expectedChunkSize > 0)
                            {
                                const auto toWrite = std::min(expectedChunkSize, responseData.size());
                                response.body.insert(response.body.end(), responseData.begin(), responseData.begin() + static_cast<ptrdiff_t>(toWrite));
                                responseData.erase(responseData.begin(), responseData.begin() + static_cast<ptrdiff_t>(toWrite));
                                expectedChunkSize -= toWrite;

                                if (expectedChunkSize == 0) removeCrlfAfterChunk = true;
                                if (responseData.empty()) break;
                            }
                            else
                            {
                                if (removeCrlfAfterChunk)
                                {
                                    if (responseData.size() >= 2)
                                    {
                                        removeCrlfAfterChunk = false;
                                        responseData.erase(responseData.begin(), responseData.begin() + 2);
                                    }
                                    else break;
                                }

                                const auto i = std::search(responseData.begin(), responseData.end(), std::begin(crlf), std::end(crlf));

                                if (i == responseData.end()) break;

                                const std::string line(responseData.begin(), i);
                                responseData.erase(responseData.begin(), i + 2);

                                expectedChunkSize = std::stoul(line, nullptr, 16);

                                if (expectedChunkSize == 0)
                                {
                                    dataReceived = true;
                                    break;
                                }
                            }
                        }

                        if (dataReceived)
                            break;
                    }
                    else
                    {
                        response.body.insert(response.body.end(), responseData.begin(), responseData.end());
                        responseData.clear();

                        // got the whole content
                        if (contentLengthReceived && response.body.size() >= contentLength)
                            break;
                    }
                }
            }

            return response;
        }